

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_long_Test::
ByteBufferTest_test_read_write_long_Test(ByteBufferTest_test_read_write_long_Test *this)

{
  ByteBufferTest_test_read_write_long_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ByteBufferTest_test_read_write_long_Test_003d0660;
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_long)
{
    int64_t long1 = 56203443221;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteLong(long1);
    EXPECT_EQ(long1, byte_buffer1.ReadLong());

    int64_t long2 = -11234837293;
    ByteBuffer byte_buffer2(8);
    byte_buffer2.WriteLong(long2);
    EXPECT_EQ(long2, byte_buffer2.ReadLong());
}